

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

Instr * __thiscall
LowererMDArch::LowerCallIDynamic
          (LowererMDArch *this,Instr *callInstr,Instr *saveThisArgOutInstr,Opnd *argsLength,
          ushort callFlags,Instr *insertBeforeInstrForCFG)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  Instr *pIVar6;
  Opnd *pOVar7;
  uint32 local_74;
  uint32 homeArgs;
  Opnd *funcObjOpnd;
  Instr *insertBeforeInstrForCFG_local;
  ushort callFlags_local;
  Opnd *argsLength_local;
  Instr *saveThisArgOutInstr_local;
  Instr *callInstr_local;
  LowererMDArch *this_local;
  
  IR::Instr::InsertBefore(callInstr,saveThisArgOutInstr);
  LoadDynamicArgument(this,saveThisArgOutInstr,3);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (bVar2) {
    pIVar5 = IR::Opnd::AsIntConstOpnd(argsLength);
    uVar3 = IR::EncodableOpnd<long>::GetValue(&pIVar5->super_EncodableOpnd<long>);
    if (uVar3 != callInstr->m_func->actualCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x260,
                         "(argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount)"
                         ,
                         "argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    SetMaxArgSlots(this,callInstr->m_func->actualCount);
  }
  else {
    pIVar5 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
    pIVar6 = IR::Instr::New(ADD,argsLength,argsLength,&pIVar5->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    SetMaxArgSlots(this,0xf);
  }
  pOVar7 = GetArgSlotOpnd(this,2,(StackSym *)0x0,false);
  pIVar6 = IR::Instr::New(MOV,pOVar7,argsLength,this->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  pOVar7 = IR::Instr::UnlinkSrc1(callInstr);
  GeneratePreCall(this,callInstr,pOVar7,insertBeforeInstrForCFG);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (bVar2) {
    local_74 = callInstr->m_func->actualCount + 2;
  }
  else {
    local_74 = 4;
  }
  LowerCall(this,callInstr,local_74);
  return callInstr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerCallIDynamic(IR::Instr *callInstr, IR::Instr*saveThisArgOutInstr, IR::Opnd *argsLength, ushort callFlags, IR::Instr * insertBeforeInstrForCFG)
{
    callInstr->InsertBefore(saveThisArgOutInstr); //Move this Argout next to call;
    this->LoadDynamicArgument(saveThisArgOutInstr, 3); //this pointer is the 3rd argument

    /*callInfo*/
    if (callInstr->m_func->IsInlinee())
    {
        Assert(argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount);
        this->SetMaxArgSlots((Js::ArgSlot)callInstr->m_func->actualCount);
    }
    else
    {
        callInstr->InsertBefore(IR::Instr::New(Js::OpCode::ADD, argsLength, argsLength, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), this->m_func));
        this->SetMaxArgSlots(Js::InlineeCallInfo::MaxInlineeArgoutCount);
    }
    callInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, this->GetArgSlotOpnd(2), argsLength, this->m_func));

    IR::Opnd    *funcObjOpnd = callInstr->UnlinkSrc1();
    GeneratePreCall(callInstr, funcObjOpnd, insertBeforeInstrForCFG);

    // Normally for dynamic calls we move 4 args to registers and push remaining
    // args onto stack (Windows convention, and unchanged on xplat). We need to
    // manully home 4 args. inlinees lower differently and follow platform ABI.
    // So we need to manually home actualArgsCount + 2 args (function, callInfo).
    const uint32 homeArgs = callInstr->m_func->IsInlinee() ?
                                callInstr->m_func->actualCount + 2 : 4;
    LowerCall(callInstr, homeArgs);

    return callInstr;
}